

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O3

int Fl_Text_Editor::kf_select_all(int param_1,Fl_Text_Editor *e)

{
  Fl_Text_Buffer *this;
  Fl *this_00;
  size_t sVar1;
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  
  this = (e->super_Fl_Text_Display).mBuffer;
  Fl_Text_Buffer::select(this,0,(fd_set *)(ulong)(uint)this->mLength,in_RCX,in_R8,in_R9);
  this_00 = (Fl *)Fl_Text_Buffer::selection_text((e->super_Fl_Text_Display).mBuffer);
  if (*this_00 != (Fl)0x0) {
    sVar1 = strlen((char *)this_00);
    Fl::copy(this_00,(EVP_PKEY_CTX *)(sVar1 & 0xffffffff),(EVP_PKEY_CTX *)0x0);
  }
  free(this_00);
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_select_all(int, Fl_Text_Editor* e) {
  e->buffer()->select(0, e->buffer()->length());
  const char *copy = e->buffer()->selection_text();
  if (*copy) Fl::copy(copy, (int) strlen(copy), 0);
  free((void*)copy);
  return 1;
}